

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn5s.cc
# Opt level: O2

void __thiscall trng::yarn5s::yarn5s(yarn5s *this,unsigned_long s,parameter_type *P)

{
  undefined8 uVar1;
  
  (this->P).a[4] = P->a[4];
  uVar1 = *(undefined8 *)(P->a + 2);
  *(undefined8 *)(this->P).a = *(undefined8 *)P->a;
  *(undefined8 *)((this->P).a + 2) = uVar1;
  mrg_status<int,_5,_trng::yarn5s>::mrg_status(&this->S);
  seed(this,s);
  return;
}

Assistant:

yarn5s::yarn5s(unsigned long s, const parameter_type &P) : P{P} { seed(s); }